

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BrokerApp.cpp
# Opt level: O2

void __thiscall
helics::BrokerApp::BrokerApp
          (BrokerApp *this,CoreType ctype,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args)

{
  string local_28;
  
  local_28._M_dataplus._M_p = (pointer)&local_28.field_2;
  local_28._M_string_length = 0;
  local_28.field_2._M_local_buf[0] = '\0';
  BrokerApp(this,ctype,&local_28,args);
  std::__cxx11::string::~string((string *)&local_28);
  return;
}

Assistant:

BrokerApp::BrokerApp(CoreType ctype, std::vector<std::string>& args):
    BrokerApp(ctype, std::string{}, args)
{
}